

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int gmatch_aux(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *p;
  lua_Integer lVar3;
  char *e;
  char *s;
  size_t lp;
  size_t ls;
  MatchState ms;
  size_t local_270;
  size_t local_268;
  MatchState local_260;
  
  pcVar2 = lua_tolstring(L,-0xf4629,&local_268);
  p = lua_tolstring(L,-0xf462a,&local_270);
  local_260.matchdepth = 200;
  local_260.src_end = pcVar2 + local_268;
  local_260.p_end = p + local_270;
  local_260.src_init = pcVar2;
  local_260.L = L;
  lVar3 = lua_tointegerx(L,-0xf462b,(int *)0x0);
  if (lVar3 <= (long)local_268) {
    s = pcVar2 + lVar3;
    do {
      local_260.level = 0;
      e = match(&local_260,s,p);
      if (e != (char *)0x0) {
        lua_pushinteger(L,(lua_Integer)(e + ((ulong)(s == e) - (long)pcVar2)));
        lua_replace(L,-0xf462b);
        iVar1 = push_captures(&local_260,s,e);
        return iVar1;
      }
      s = s + 1;
    } while (s <= local_260.src_end);
  }
  return 0;
}

Assistant:

static int gmatch_aux (lua_State *L) {
  MatchState ms;
  size_t ls, lp;
  const char *s = lua_tolstring(L, lua_upvalueindex(1), &ls);
  const char *p = lua_tolstring(L, lua_upvalueindex(2), &lp);
  const char *src;
  ms.L = L;
  ms.matchdepth = MAXCCALLS;
  ms.src_init = s;
  ms.src_end = s+ls;
  ms.p_end = p + lp;
  for (src = s + (size_t)lua_tointeger(L, lua_upvalueindex(3));
       src <= ms.src_end;
       src++) {
    const char *e;
    ms.level = 0;
    lua_assert(ms.matchdepth == MAXCCALLS);
    if ((e = match(&ms, src, p)) != NULL) {
      lua_Integer newstart = e-s;
      if (e == src) newstart++;  /* empty match? go at least one position */
      lua_pushinteger(L, newstart);
      lua_replace(L, lua_upvalueindex(3));
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}